

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AirLock.hpp
# Opt level: O0

void __thiscall
gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
load<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
          (AirLock<std::any,_std::mutex,_std::condition_variable> *this,
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *val)

{
  bool bVar1;
  mutex_type *in_RDI;
  unique_lock<std::mutex> lock;
  memory_order in_stack_ffffffffffffffd0;
  memory_order in_stack_ffffffffffffffd4;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffffd8;
  any *in_stack_ffffffffffffffe0;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  if (bVar1) {
    while (bVar1 = std::atomic<bool>::load
                             ((atomic<bool> *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4),
          bVar1) {
      std::condition_variable::wait
                ((unique_lock *)&in_RDI[1].super___mutex_base._M_mutex.__data.__list);
    }
    std::any::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::atomic<bool>::store
              ((atomic<bool> *)in_stack_ffffffffffffffd8,SUB41(in_stack_ffffffffffffffd4 >> 0x18,0),
               in_stack_ffffffffffffffd0);
  }
  else {
    std::any::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::atomic<bool>::store
              ((atomic<bool> *)in_stack_ffffffffffffffd8,SUB41(in_stack_ffffffffffffffd4 >> 0x18,0),
               in_stack_ffffffffffffffd0);
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void load(Z&& val)
    {
        std::unique_lock<MUTEX> lock(door);
        if (!loaded.load(std::memory_order_acquire)) {
            data = std::forward<Z>(val);
            loaded.store(true, std::memory_order_release);
        } else {
            while (loaded.load(std::memory_order_acquire)) {
                condition.wait(lock);
            }
            data = std::forward<Z>(val);
            loaded.store(true, std::memory_order_release);
        }
    }